

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

void __thiscall Pathie::Path::make_symlink(Path *this,Path *target)

{
  int iVar1;
  char *__from;
  char *__to;
  ErrnoError *this_00;
  int *piVar2;
  undefined1 local_58 [8];
  string nstr;
  undefined1 local_38 [8];
  string target_nstr;
  Path *target_local;
  Path *this_local;
  
  native_abi_cxx11_((Path *)local_38);
  native_abi_cxx11_((Path *)local_58);
  __from = (char *)std::__cxx11::string::c_str();
  __to = (char *)std::__cxx11::string::c_str();
  iVar1 = symlink(__from,__to);
  if (iVar1 < 0) {
    this_00 = (ErrnoError *)__cxa_allocate_exception(0x30);
    piVar2 = __errno_location();
    ErrnoError::ErrnoError(this_00,*piVar2);
    __cxa_throw(this_00,&ErrnoError::typeinfo,ErrnoError::~ErrnoError);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Path::make_symlink(const Path& target) const
{
#if defined(_PATHIE_UNIX)
  std::string target_nstr = target.native();
  std::string nstr = native();

  if (symlink(target_nstr.c_str(), nstr.c_str()) < 0)
    throw(Pathie::ErrnoError(errno));
#elif defined(_WIN32)
  std::wstring source = utf8_to_utf16(m_path);
  std::wstring target2 = utf8_to_utf16(target.m_path);

  DWORD flags = 0;
  if (target.is_directory())
    flags = SYMBOLIC_LINK_FLAG_DIRECTORY;

  if (CreateSymbolicLinkW(source.c_str(), target2.c_str(), flags) == 0) {
    DWORD err = GetLastError();
    throw(Pathie::WindowsError(err));
  }
#else
#error Unsupported system.
#endif
}